

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O0

void Eigen::internal::init_scoring<int>
               (int n_row,int n_col,Colamd_Row<int> *Row,colamd_col<int> *Col,int *A,int *head,
               double *knobs,int *p_n_row2,int *p_n_col2,int *p_max_deg)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int local_c4;
  int local_c0;
  int local_bc;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  int local_80;
  int next_col;
  int max_deg;
  int min_score;
  int dense_col_count;
  int dense_row_count;
  int n_row2;
  int n_col2;
  int score;
  int col_length;
  int *new_cp;
  int *cp_end;
  int *piStack_48;
  int deg;
  int *cp;
  int local_38;
  int row;
  int r;
  int c;
  int *head_local;
  int *A_local;
  colamd_col<int> *Col_local;
  Colamd_Row<int> *Row_local;
  int n_col_local;
  int n_row_local;
  
  if ((double)n_col <= *knobs * (double)n_col) {
    local_90 = (double)n_col;
  }
  else {
    local_90 = *knobs * (double)n_col;
  }
  if (0.0 <= local_90) {
    if ((double)n_col <= *knobs * (double)n_col) {
      local_a0 = (double)n_col;
    }
    else {
      local_a0 = *knobs * (double)n_col;
    }
    local_98 = local_a0;
  }
  else {
    local_98 = 0.0;
  }
  if ((double)n_row <= knobs[1] * (double)n_row) {
    local_a8 = (double)n_row;
  }
  else {
    local_a8 = knobs[1] * (double)n_row;
  }
  if (0.0 <= local_a8) {
    if ((double)n_row <= knobs[1] * (double)n_row) {
      local_b8 = (double)n_row;
    }
    else {
      local_b8 = knobs[1] * (double)n_row;
    }
    local_b0 = local_b8;
  }
  else {
    local_b0 = 0.0;
  }
  local_80 = 0;
  dense_row_count = n_col;
  for (row = n_col + -1; -1 < row; row = row + -1) {
    if (Col[row].length == 0) {
      dense_row_count = dense_row_count + -1;
      Col[row].shared2.score = dense_row_count;
      Col[row].start = -1;
    }
  }
  for (row = n_col + -1; -1 < row; row = row + -1) {
    if ((-1 < Col[row].start) && ((int)local_b0 < Col[row].length)) {
      dense_row_count = dense_row_count + -1;
      Col[row].shared2.score = dense_row_count;
      iVar2 = Col[row].start;
      iVar1 = Col[row].length;
      piStack_48 = A + iVar2;
      while (piStack_48 < A + iVar2 + iVar1) {
        Row[*piStack_48].shared1.degree = Row[*piStack_48].shared1.degree + -1;
        piStack_48 = piStack_48 + 1;
      }
      Col[row].start = -1;
    }
  }
  dense_col_count = n_row;
  for (local_38 = 0; local_38 < n_row; local_38 = local_38 + 1) {
    local_bc = Row[local_38].shared1.degree;
    if (((int)local_98 < local_bc) || (local_bc == 0)) {
      Row[local_38].shared2.mark = -1;
      dense_col_count = dense_col_count + -1;
    }
    else {
      if (local_bc < local_80) {
        local_bc = local_80;
      }
      local_80 = local_bc;
    }
  }
  for (row = n_col + -1; -1 < row; row = row + -1) {
    if (-1 < Col[row].start) {
      n_row2 = 0;
      piVar3 = A + Col[row].start;
      iVar2 = Col[row].length;
      _score = piVar3;
      piStack_48 = piVar3;
      while (piStack_48 < piVar3 + iVar2) {
        piVar4 = piStack_48 + 1;
        iVar1 = *piStack_48;
        piStack_48 = piVar4;
        if (-1 < Row[iVar1].shared2.mark) {
          *_score = iVar1;
          iVar1 = Row[iVar1].shared1.degree + -1 + n_row2;
          local_c0 = n_col;
          if (iVar1 < n_col) {
            local_c0 = iVar1;
          }
          n_row2 = local_c0;
          _score = _score + 1;
        }
      }
      iVar2 = (int)((long)_score - (long)(A + Col[row].start) >> 2);
      if (iVar2 == 0) {
        dense_row_count = dense_row_count + -1;
        Col[row].shared2.score = dense_row_count;
        Col[row].start = -1;
      }
      else {
        Col[row].length = iVar2;
        Col[row].shared2.score = n_row2;
      }
    }
  }
  for (row = 0; row <= n_col; row = row + 1) {
    head[row] = -1;
  }
  next_col = n_col;
  for (row = n_col + -1; -1 < row; row = row + -1) {
    if (-1 < Col[row].start) {
      local_c4 = Col[row].shared2.score;
      iVar2 = head[local_c4];
      Col[row].shared3.headhash = -1;
      Col[row].shared4.degree_next = iVar2;
      if (iVar2 != -1) {
        Col[iVar2].shared3.headhash = row;
      }
      head[local_c4] = row;
      if (next_col < local_c4) {
        local_c4 = next_col;
      }
      next_col = local_c4;
    }
  }
  *p_n_col2 = dense_row_count;
  *p_n_row2 = dense_col_count;
  *p_max_deg = local_80;
  return;
}

Assistant:

static void init_scoring
  (
    /* === Parameters ======================================================= */

    Index n_row,      /* number of rows of A */
    Index n_col,      /* number of columns of A */
    Colamd_Row<Index> Row [],    /* of size n_row+1 */
    colamd_col<Index> Col [],    /* of size n_col+1 */
    Index A [],     /* column form and row form of A */
    Index head [],    /* of size n_col+1 */
    double knobs [COLAMD_KNOBS],/* parameters */
    Index *p_n_row2,    /* number of non-dense, non-empty rows */
    Index *p_n_col2,    /* number of non-dense, non-empty columns */
    Index *p_max_deg    /* maximum row degree */
    )
{
  /* === Local variables ================================================== */

  Index c ;     /* a column index */
  Index r, row ;    /* a row index */
  Index *cp ;     /* a column pointer */
  Index deg ;     /* degree of a row or column */
  Index *cp_end ;   /* a pointer to the end of a column */
  Index *new_cp ;   /* new column pointer */
  Index col_length ;    /* length of pruned column */
  Index score ;     /* current column score */
  Index n_col2 ;    /* number of non-dense, non-empty columns */
  Index n_row2 ;    /* number of non-dense, non-empty rows */
  Index dense_row_count ; /* remove rows with more entries than this */
  Index dense_col_count ; /* remove cols with more entries than this */
  Index min_score ;   /* smallest column score */
  Index max_deg ;   /* maximum row degree */
  Index next_col ;    /* Used to add to degree list.*/


  /* === Extract knobs ==================================================== */

  dense_row_count = COLAMD_MAX (0, COLAMD_MIN (knobs [COLAMD_DENSE_ROW] * n_col, n_col)) ;
  dense_col_count = COLAMD_MAX (0, COLAMD_MIN (knobs [COLAMD_DENSE_COL] * n_row, n_row)) ;
  COLAMD_DEBUG1 (("colamd: densecount: %d %d\n", dense_row_count, dense_col_count)) ;
  max_deg = 0 ;
  n_col2 = n_col ;
  n_row2 = n_row ;

  /* === Kill empty columns =============================================== */

  /* Put the empty columns at the end in their natural order, so that LU */
  /* factorization can proceed as far as possible. */
  for (c = n_col-1 ; c >= 0 ; c--)
  {
    deg = Col [c].length ;
    if (deg == 0)
    {
      /* this is a empty column, kill and order it last */
      Col [c].shared2.order = --n_col2 ;
      KILL_PRINCIPAL_COL (c) ;
    }
  }
  COLAMD_DEBUG1 (("colamd: null columns killed: %d\n", n_col - n_col2)) ;

  /* === Kill dense columns =============================================== */

  /* Put the dense columns at the end, in their natural order */
  for (c = n_col-1 ; c >= 0 ; c--)
  {
    /* skip any dead columns */
    if (COL_IS_DEAD (c))
    {
      continue ;
    }
    deg = Col [c].length ;
    if (deg > dense_col_count)
    {
      /* this is a dense column, kill and order it last */
      Col [c].shared2.order = --n_col2 ;
      /* decrement the row degrees */
      cp = &A [Col [c].start] ;
      cp_end = cp + Col [c].length ;
      while (cp < cp_end)
      {
	Row [*cp++].shared1.degree-- ;
      }
      KILL_PRINCIPAL_COL (c) ;
    }
  }
  COLAMD_DEBUG1 (("colamd: Dense and null columns killed: %d\n", n_col - n_col2)) ;

  /* === Kill dense and empty rows ======================================== */

  for (r = 0 ; r < n_row ; r++)
  {
    deg = Row [r].shared1.degree ;
    COLAMD_ASSERT (deg >= 0 && deg <= n_col) ;
    if (deg > dense_row_count || deg == 0)
    {
      /* kill a dense or empty row */
      KILL_ROW (r) ;
      --n_row2 ;
    }
    else
    {
      /* keep track of max degree of remaining rows */
      max_deg = COLAMD_MAX (max_deg, deg) ;
    }
  }
  COLAMD_DEBUG1 (("colamd: Dense and null rows killed: %d\n", n_row - n_row2)) ;

  /* === Compute initial column scores ==================================== */

  /* At this point the row degrees are accurate.  They reflect the number */
  /* of "live" (non-dense) columns in each row.  No empty rows exist. */
  /* Some "live" columns may contain only dead rows, however.  These are */
  /* pruned in the code below. */

  /* now find the initial matlab score for each column */
  for (c = n_col-1 ; c >= 0 ; c--)
  {
    /* skip dead column */
    if (COL_IS_DEAD (c))
    {
      continue ;
    }
    score = 0 ;
    cp = &A [Col [c].start] ;
    new_cp = cp ;
    cp_end = cp + Col [c].length ;
    while (cp < cp_end)
    {
      /* get a row */
      row = *cp++ ;
      /* skip if dead */
      if (ROW_IS_DEAD (row))
      {
	continue ;
      }
      /* compact the column */
      *new_cp++ = row ;
      /* add row's external degree */
      score += Row [row].shared1.degree - 1 ;
      /* guard against integer overflow */
      score = COLAMD_MIN (score, n_col) ;
    }
    /* determine pruned column length */
    col_length = (Index) (new_cp - &A [Col [c].start]) ;
    if (col_length == 0)
    {
      /* a newly-made null column (all rows in this col are "dense" */
      /* and have already been killed) */
      COLAMD_DEBUG2 (("Newly null killed: %d\n", c)) ;
      Col [c].shared2.order = --n_col2 ;
      KILL_PRINCIPAL_COL (c) ;
    }
    else
    {
      /* set column length and set score */
      COLAMD_ASSERT (score >= 0) ;
      COLAMD_ASSERT (score <= n_col) ;
      Col [c].length = col_length ;
      Col [c].shared2.score = score ;
    }
  }
  COLAMD_DEBUG1 (("colamd: Dense, null, and newly-null columns killed: %d\n",
		  n_col-n_col2)) ;

  /* At this point, all empty rows and columns are dead.  All live columns */
  /* are "clean" (containing no dead rows) and simplicial (no supercolumns */
  /* yet).  Rows may contain dead columns, but all live rows contain at */
  /* least one live column. */

  /* === Initialize degree lists ========================================== */


  /* clear the hash buckets */
  for (c = 0 ; c <= n_col ; c++)
  {
    head [c] = COLAMD_EMPTY ;
  }
  min_score = n_col ;
  /* place in reverse order, so low column indices are at the front */
  /* of the lists.  This is to encourage natural tie-breaking */
  for (c = n_col-1 ; c >= 0 ; c--)
  {
    /* only add principal columns to degree lists */
    if (COL_IS_ALIVE (c))
    {
      COLAMD_DEBUG4 (("place %d score %d minscore %d ncol %d\n",
		      c, Col [c].shared2.score, min_score, n_col)) ;

      /* === Add columns score to DList =============================== */

      score = Col [c].shared2.score ;

      COLAMD_ASSERT (min_score >= 0) ;
      COLAMD_ASSERT (min_score <= n_col) ;
      COLAMD_ASSERT (score >= 0) ;
      COLAMD_ASSERT (score <= n_col) ;
      COLAMD_ASSERT (head [score] >= COLAMD_EMPTY) ;

      /* now add this column to dList at proper score location */
      next_col = head [score] ;
      Col [c].shared3.prev = COLAMD_EMPTY ;
      Col [c].shared4.degree_next = next_col ;

      /* if there already was a column with the same score, set its */
      /* previous pointer to this new column */
      if (next_col != COLAMD_EMPTY)
      {
	Col [next_col].shared3.prev = c ;
      }
      head [score] = c ;

      /* see if this score is less than current min */
      min_score = COLAMD_MIN (min_score, score) ;


    }
  }


  /* === Return number of remaining columns, and max row degree =========== */

  *p_n_col2 = n_col2 ;
  *p_n_row2 = n_row2 ;
  *p_max_deg = max_deg ;
}